

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ItemSize(ImVec2 *size,float text_offset_y)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *g;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if (pIVar3->SkipItems == false) {
    fVar1 = (pIVar3->DC).CurrentLineHeight;
    uVar5 = -(uint)(size->y <= fVar1);
    fVar7 = (float)(~uVar5 & (uint)size->y | (uint)fVar1 & uVar5);
    fVar1 = (pIVar3->DC).CurrentLineTextBaseOffset;
    uVar5 = -(uint)(text_offset_y <= fVar1);
    fVar2 = (pIVar3->Pos).x;
    fVar9 = (pIVar3->DC).CursorPos.x + size->x;
    fVar8 = (pIVar3->DC).CursorPos.y;
    (pIVar3->DC).CursorPosPrevLine.x = fVar9;
    (pIVar3->DC).CursorPosPrevLine.y = fVar8;
    fVar8 = (float)(int)(fVar7 + fVar8 + (pIVar4->Style).ItemSpacing.y);
    (pIVar3->DC).CursorPos.x =
         (float)(int)(fVar2 + (pIVar3->DC).IndentX + (pIVar3->DC).ColumnsOffsetX);
    (pIVar3->DC).CursorPos.y = fVar8;
    fVar2 = (pIVar3->DC).CursorMaxPos.x;
    uVar6 = -(uint)(fVar9 <= fVar2);
    (pIVar3->DC).CursorMaxPos.x = (float)(uVar6 & (uint)fVar2 | ~uVar6 & (uint)fVar9);
    fVar2 = (pIVar3->DC).CursorMaxPos.y;
    fVar8 = fVar8 - (pIVar4->Style).ItemSpacing.y;
    uVar6 = -(uint)(fVar8 <= fVar2);
    (pIVar3->DC).CursorMaxPos.y = (float)(uVar6 & (uint)fVar2 | ~uVar6 & (uint)fVar8);
    (pIVar3->DC).PrevLineHeight = fVar7;
    (pIVar3->DC).PrevLineTextBaseOffset =
         (float)(~uVar5 & (uint)text_offset_y | (uint)fVar1 & uVar5);
    (pIVar3->DC).CurrentLineHeight = 0.0;
    (pIVar3->DC).CurrentLineTextBaseOffset = 0.0;
    if ((pIVar3->DC).LayoutType == 1) {
      pIVar3 = pIVar4->CurrentWindow;
      pIVar3->WriteAccessed = true;
      if (pIVar3->SkipItems == false) {
        (pIVar3->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
        (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
        (pIVar3->DC).CurrentLineHeight = (pIVar3->DC).PrevLineHeight;
        (pIVar3->DC).CurrentLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      }
    }
  }
  return;
}

Assistant:

void ImGui::ItemSize(const ImVec2& size, float text_offset_y)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // Always align ourselves on pixel boundaries
    const float line_height = ImMax(window->DC.CurrentLineHeight, size.y);
    const float text_base_offset = ImMax(window->DC.CurrentLineTextBaseOffset, text_offset_y);
    //if (g.IO.KeyAlt) window->DrawList->AddRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(size.x, line_height), IM_COL32(255,0,0,200)); // [DEBUG]
    window->DC.CursorPosPrevLine = ImVec2(window->DC.CursorPos.x + size.x, window->DC.CursorPos.y);
    window->DC.CursorPos = ImVec2((float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX), (float)(int)(window->DC.CursorPos.y + line_height + g.Style.ItemSpacing.y));
    window->DC.CursorMaxPos.x = ImMax(window->DC.CursorMaxPos.x, window->DC.CursorPosPrevLine.x);
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, window->DC.CursorPos.y - g.Style.ItemSpacing.y);
    //if (g.IO.KeyAlt) window->DrawList->AddCircle(window->DC.CursorMaxPos, 3.0f, IM_COL32(255,0,0,255), 4); // [DEBUG]

    window->DC.PrevLineHeight = line_height;
    window->DC.PrevLineTextBaseOffset = text_base_offset;
    window->DC.CurrentLineHeight = window->DC.CurrentLineTextBaseOffset = 0.0f;

    // Horizontal layout mode
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
        SameLine();
}